

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O1

bool __thiscall Am_Input_Char::Exit_If_Stop_Char(Am_Input_Char *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ((uint)Am_Stop_Character & 0xffff) != 0x103;
  bVar2 = this->code == 0x103;
  if ((bool)((bVar1 && bVar2) | ~(bVar1 || bVar2) & 1U)) {
    bVar1 = false;
  }
  else {
    bVar1 = helper_check_equal(this,Am_Stop_Character);
  }
  if (bVar1 != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Got stop event: exiting Amulet main loop.",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  return bVar1;
}

Assistant:

bool
Am_Input_Char::Exit_If_Stop_Char() const
{
  if (*this == Am_Stop_Character) {
    std::cerr << "Got stop event: exiting Amulet main loop." << std::endl;
    //    Am_Main_Loop_Go = false;
    return true;
  } else
    return false;
}